

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

void Imf_3_2::(anonymous_namespace)::
     readStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (char **readPtr,char *endPtr,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *outputVector,int numberOfStrings)

{
  long lVar1;
  InputExc *pIVar2;
  uint64_t uVar3;
  reference pvVar4;
  int in_ECX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  ulong in_RSI;
  long *in_RDI;
  int i_1;
  int i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> lengths;
  value_type *in_stack_ffffffffffffff08;
  iterator in_stack_ffffffffffffff10;
  const_iterator __position;
  allocator_type *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  value_type vVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff30;
  allocator *paVar6;
  allocator local_89;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  int local_54;
  int local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  int local_1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  ulong local_10;
  long *local_8;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_ECX == 0) {
    if (in_RSI < *in_RDI + 4U) {
      pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::InputExc::InputExc(pIVar2,"IDManifest too small for string list size");
      __cxa_throw(pIVar2,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
    }
    Xdr::read<Imf_3_2::CharPtrIO,char_const*>
              ((char **)in_stack_ffffffffffffff10._M_current,(int *)in_stack_ffffffffffffff08);
  }
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x20c30f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x20c335);
  for (local_50 = 0; local_50 < local_1c; local_50 = local_50 + 1) {
    uVar3 = anon_unknown_3::readVariableLengthInteger
                      ((char **)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_48,(long)local_50);
    *pvVar4 = uVar3;
  }
  local_54 = 0;
  while( true ) {
    if (local_1c <= local_54) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff20)
      ;
      return;
    }
    lVar1 = *local_8;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_48,(long)local_54);
    if (local_10 < lVar1 + *pvVar4) break;
    __position._M_current = local_18;
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffff08);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffff10._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff20 = (allocator_type *)*local_8;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_48,(long)local_54);
    vVar5 = *pvVar4;
    paVar6 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,(char *)in_stack_ffffffffffffff20,vVar5,paVar6);
    in_stack_ffffffffffffff10 =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::insert(in_stack_ffffffffffffff10._M_current,__position,in_stack_ffffffffffffff08);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_48,(long)local_54);
    *local_8 = *pvVar4 + *local_8;
    local_54 = local_54 + 1;
  }
  pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::InputExc::InputExc(pIVar2,"IDManifest too small for string");
  __cxa_throw(pIVar2,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
}

Assistant:

void
readStringList (
    const char*& readPtr,
    const char*  endPtr,
    T&           outputVector,
    int          numberOfStrings = 0)
{
    if (numberOfStrings == 0)
    {
        if (readPtr + 4 > endPtr)
        {
            throw IEX_NAMESPACE::InputExc (
                "IDManifest too small for string list size");
        }
        Xdr::read<CharPtrIO> (readPtr, numberOfStrings);
    }

    vector<size_t> lengths (numberOfStrings);

    for (int i = 0; i < numberOfStrings; ++i)
    {
        lengths[i] = readVariableLengthInteger (readPtr, endPtr);
    }
    for (int i = 0; i < numberOfStrings; ++i)
    {

        if (readPtr + lengths[i] > endPtr)
        {
            throw IEX_NAMESPACE::InputExc ("IDManifest too small for string");
        }
        outputVector.insert (outputVector.end (), string (readPtr, lengths[i]));
        readPtr += lengths[i];
    }
}